

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O1

void Diligent::GetGLSLVersion
               (ShaderCreateInfo *ShaderCI,TargetGLSLCompiler TargetCompiler,
               RENDER_DEVICE_TYPE DeviceType,RenderDeviceShaderVersionInfo *MaxShaderVersion,
               ShaderVersion *GLSLVer,bool *IsES)

{
  bool bVar1;
  uint uVar2;
  ShaderVersion SVar3;
  char (*in_stack_ffffffffffffffb8) [2];
  ShaderVersion CompilerVer;
  string _msg;
  
  *IsES = DeviceType == RENDER_DEVICE_TYPE_GLES;
  CompilerVer = (&MaxShaderVersion->GLSL)[DeviceType == RENDER_DEVICE_TYPE_GLES];
  if (DeviceType == RENDER_DEVICE_TYPE_GLES && TargetCompiler == glslang) {
    bVar1 = 3 < CompilerVer.Major;
    if (CompilerVer.Major == 3) {
      bVar1 = 1 < CompilerVer.Minor;
    }
    if (!bVar1) {
      CompilerVer.Major = 3;
      CompilerVer.Minor = 1;
    }
  }
  SVar3 = (&ShaderCI->GLSLVersion)[DeviceType == RENDER_DEVICE_TYPE_GLES];
  *GLSLVer = SVar3;
  uVar2 = SVar3.Major;
  if (uVar2 == 0 && GLSLVer->Minor == 0) {
    SVar3 = CompilerVer;
    if ((CompilerVer.Major == 0 && CompilerVer.Minor == 0) &&
       (SVar3.Major = 4, SVar3.Minor = 3, *IsES == true)) {
      FormatString<char[26],char[6]>
                (&_msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!IsES",
                 (char (*) [6])((ulong)CompilerVer & 0xffffffff));
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"GetGLSLVersion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                 ,0x6e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    if (CompilerVer.Major == 0 && CompilerVer.Minor == 0) {
      return;
    }
    bVar1 = CompilerVer.Major < uVar2;
    if (uVar2 == CompilerVer.Major) {
      bVar1 = CompilerVer.Minor < GLSLVer->Minor;
    }
    if (!bVar1) {
      return;
    }
    FormatString<char[25],unsigned_int,char[2],unsigned_int,char[50],unsigned_int,char[2],unsigned_int,char[2]>
              (&_msg,(Diligent *)"Requested GLSL version (",(char (*) [25])GLSLVer,(uint *)0x35ed3e,
               (char (*) [2])&GLSLVer->Minor,
               (uint *)") is greater than the maximum supported version (",
               (char (*) [50])&CompilerVer,(uint *)0x35ed3e,(char (*) [2])&CompilerVer.Minor,
               (uint *)0x33e49a,in_stack_ffffffffffffffb8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    SVar3 = CompilerVer;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      SVar3 = CompilerVer;
    }
  }
  *GLSLVer = SVar3;
  return;
}

Assistant:

void GetGLSLVersion(const ShaderCreateInfo&              ShaderCI,
                    TargetGLSLCompiler                   TargetCompiler,
                    RENDER_DEVICE_TYPE                   DeviceType,
                    const RenderDeviceShaderVersionInfo& MaxShaderVersion,
                    ShaderVersion&                       GLSLVer,
                    bool&                                IsES)
{
    IsES = IsESSL(DeviceType);

    ShaderVersion CompilerVer = IsES ? MaxShaderVersion.GLESSL : MaxShaderVersion.GLSL;
    if (TargetCompiler == TargetGLSLCompiler::glslang)
    {
        if (IsES)
        {
            // glslang requires at least GLES3.1
            CompilerVer = ShaderVersion::Max(CompilerVer, ShaderVersion{3, 1});
        }
        else
        {
#if PLATFORM_APPLE
            CompilerVer = ShaderVersion{4, 3};
#endif
        }
    }

    GLSLVer = IsES ? ShaderCI.GLESSLVersion : ShaderCI.GLSLVersion;
    if (GLSLVer != ShaderVersion{})
    {
        if (CompilerVer != ShaderVersion{} && GLSLVer > CompilerVer)
        {
            LOG_WARNING_MESSAGE("Requested GLSL version (", GLSLVer.Major, ".", GLSLVer.Minor,
                                ") is greater than the maximum supported version (",
                                CompilerVer.Major, ".", CompilerVer.Minor, ")");
            GLSLVer = CompilerVer;
        }
    }
    else if (CompilerVer != ShaderVersion{})
    {
        GLSLVer = CompilerVer;
    }
    else
    {
#if PLATFORM_WIN32 || PLATFORM_LINUX
        {
            VERIFY_EXPR(!IsES);
            GLSLVer = {4, 3};
        }
#elif PLATFORM_MACOS
        {
            VERIFY_EXPR(!IsES);
            VERIFY_EXPR(TargetCompiler == TargetGLSLCompiler::driver);
            GLSLVer = {4, 1};
        }
#elif PLATFORM_ANDROID || PLATFORM_IOS || PLATFORM_TVOS || PLATFORM_WEB
        {
            VERIFY_EXPR(IsES);
            if (DeviceType == RENDER_DEVICE_TYPE_VULKAN || DeviceType == RENDER_DEVICE_TYPE_METAL)
            {
                GLSLVer = {3, 1};
            }
            else if (DeviceType == RENDER_DEVICE_TYPE_GLES)
            {
                GLSLVer = {3, 0};
            }
            else
            {
                UNEXPECTED("Unexpected device type");
            }
        }
#else
#    error Unknown platform
#endif
    }
}